

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O0

void * operator_new(size_t size,align_val_t val)

{
  bool bVar1;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *pAVar2;
  size_t sVar3;
  smallsizeclass_t sVar4;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *this;
  anon_class_8_1_8991fb9c in_RSI;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_RDI;
  undefined8 *in_FS_OFFSET;
  size_t result;
  size_t result_1;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  p;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *fl;
  smallsizeclass_t sizeclass;
  FreeListKey *key;
  anon_class_8_1_8991fb9c domesticate;
  Alloc<void> r;
  size_t in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *pAVar5;
  FreeListKey *key_00;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *sizeclass_00;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *alloc;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this_00;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_130;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_d0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_70;
  
  pAVar2 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
           (((ulong)&in_RSI.this[-1].field_0x23ff |
            (ulong)((long)&in_RDI[-1].curr.unsafe_capptr + 7U)) + 1);
  sizeclass_00 = in_RSI.this;
  bVar1 = snmalloc::is_small_sizeclass(in_stack_fffffffffffffe30);
  if (((!bVar1) &&
      (pAVar2 == (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                  *)0x0)) &&
     (in_RDI != (Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                 *)0x0)) {
    pAVar2 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             0xffffffffffffffff;
  }
  pAVar5 = *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **)
            *in_FS_OFFSET;
  alloc = pAVar2;
  this_00 = pAVar2;
  snmalloc::is_small_sizeclass(in_stack_fffffffffffffe30);
  key_00 = (FreeListKey *)&pAVar2[-1].field_0x23ff;
  pAVar2 = pAVar5;
  sVar3 = snmalloc::sizeclass_to_size((smallsizeclass_t)key_00);
  if ((FreeListKey *)(sVar3 - 1) < key_00) {
    local_130 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                 *)snmalloc::
                   Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                   ::alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>
                             ((size_t)in_RSI.this,pAVar2);
  }
  else {
    sVar4 = snmalloc::size_to_sizeclass(in_stack_fffffffffffffe28);
    this = (pAVar5->super_FastFreeLists).small_fast_free_lists + sVar4;
    bVar1 = snmalloc::freelist::
            Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            ::empty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pAVar2 = pAVar5;
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      message_queue((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                     *)0x1437c2);
      bVar1 = snmalloc::RemoteAllocator::can_dequeue((RemoteAllocator *)0x1437ca);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_70 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                    *)snmalloc::
                      Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                      ::
                      handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                                (pAVar2,pAVar5,sVar4,this);
      }
      else {
        local_70 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                    *)snmalloc::
                      Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                      ::small_alloc<(snmalloc::ZeroMem)0,_snmalloc::CheckInitPthread>::
                      anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)this_00,alloc,
                                 (smallsizeclass_t)sizeclass_00,in_RDI);
      }
      local_d0 = local_70;
    }
    else {
      local_d0 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                  *)snmalloc::freelist::
                    Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                    ::
                    take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                              ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                                *)pAVar2,key_00,in_RSI);
    }
    local_130 = local_d0;
  }
  return local_130;
}

Assistant:

void* operator new(size_t size, std::align_val_t val)
{
  size = snmalloc::aligned_size(size_t(val), size);
  return snmalloc::libc::malloc(size);
}